

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O2

aom_image_t * encoder_get_preview(aom_codec_alg_priv_t_conflict *ctx)

{
  int iVar1;
  void *user_priv;
  aom_image_t *img;
  YV12_BUFFER_CONFIG sd;
  YV12_BUFFER_CONFIG YStack_d8;
  
  iVar1 = av1_get_preview_raw_frame(ctx->ppi->cpi,&YStack_d8);
  if (iVar1 == 0) {
    img = &ctx->preview_img;
    yuvconfig2image(img,&YStack_d8,user_priv);
  }
  else {
    img = (aom_image_t *)0x0;
  }
  return img;
}

Assistant:

static aom_image_t *encoder_get_preview(aom_codec_alg_priv_t *ctx) {
  YV12_BUFFER_CONFIG sd;

  if (av1_get_preview_raw_frame(ctx->ppi->cpi, &sd) == 0) {
    yuvconfig2image(&ctx->preview_img, &sd, NULL);
    return &ctx->preview_img;
  } else {
    return NULL;
  }
}